

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmselect.c
# Opt level: O1

periodic_task_handle_conflict
libcmselect_LTX_add_delayed_task
          (CMtrans_services svc,select_data_ptr *sdp,int delay_sec,int delay_usec,
          select_list_func func,void *arg1,void *arg2)

{
  int iVar1;
  periodic_task_handle_conflict p_Var2;
  ulong uVar3;
  long lVar4;
  select_data_ptr sd;
  
  sd = *sdp;
  p_Var2 = (periodic_task_handle_conflict)select_malloc(0x40);
  if (sd == (select_data_ptr)0x0) {
    init_select_data(svc,sdp,(CManager_conflict)0x0);
    sd = *sdp;
  }
  if (sd->cm != (CManager)0x0) {
    iVar1 = (*svc->return_CM_lock_status)
                      (sd->cm,
                       "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
                       ,700);
    if (iVar1 == 0) {
      printf("%s:%u: failed assertion `%s\'\n",
             "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/EVPath/EVPath/cmselect.c"
             ,700,"CM_LOCKED(svc, sd->cm)");
      abort();
    }
  }
  p_Var2->period_sec = 0;
  p_Var2->period_usec = 0;
  p_Var2->executing = 0xffffffffffffffff;
  gettimeofday((timeval *)&p_Var2->next_time,(__timezone_ptr_t)0x0);
  uVar3 = (long)delay_usec + (p_Var2->next_time).tv_usec;
  (p_Var2->next_time).tv_usec = uVar3;
  lVar4 = (long)delay_sec + (p_Var2->next_time).tv_sec;
  (p_Var2->next_time).tv_sec = lVar4;
  if (999999 < (long)uVar3) {
    (p_Var2->next_time).tv_sec = lVar4 + uVar3 / 1000000;
    (p_Var2->next_time).tv_usec = uVar3 % 1000000;
  }
  p_Var2->func = func;
  p_Var2->arg1 = arg1;
  p_Var2->arg2 = arg2;
  p_Var2->next = (periodic_task_handle)0x0;
  p_Var2->next = sd->periodic_task_list;
  sd->periodic_task_list = p_Var2;
  wake_server_thread(sd);
  return p_Var2;
}

Assistant:

extern periodic_task_handle
libcmselect_LTX_add_delayed_task(CMtrans_services svc, select_data_ptr *sdp, int delay_sec, int delay_usec, select_list_func func, void *arg1, void *arg2)
{
    select_data_ptr sd = *((select_data_ptr *)sdp);
    periodic_task_handle handle = malloc(sizeof(struct _periodic_task));
    if (sd == NULL) {
	init_select_data(svc, (select_data_ptr*)sdp, (CManager)NULL);
	sd = *((select_data_ptr *)sdp);
    }

    if (sd->cm) {
	/* assert CM is locked */
	assert(CM_LOCKED(svc, sd->cm));
    }
    handle->period_sec = 0;
    handle->period_usec = 0;
    handle->executing = (thr_thread_id) -1;
#ifndef HAVE_WINDOWS_H
    gettimeofday(&handle->next_time, NULL);
#else
    {
	/* GSE...  No gettimeofday on windows.  
	 * Must use _ftime, get millisec time, convert to usec.  Bleh.
	 */
	struct _timeb nowb;
	_ftime(&nowb);
	handle->next_time.tv_sec = (long)nowb.time;
	handle->next_time.tv_usec = (long)(nowb.millitm * 1000);
    }
#endif
    increment_time(&handle->next_time, delay_sec, delay_usec);
    handle->func = func;
    handle->arg1 = arg1;
    handle->arg2 = arg2;
    handle->next = NULL;

    if (sd->periodic_task_list == NULL) {
	sd->periodic_task_list = handle;
    } else {
	handle->next = sd->periodic_task_list;
	sd->periodic_task_list = handle;
    }
    wake_server_thread(sd);
    return handle;
}